

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

bool __thiscall smf::MidiMessage::isText(MidiMessage *this)

{
  bool bVar1;
  
  bVar1 = isMeta(this);
  if (bVar1) {
    bVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[1] == '\x01';
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool MidiMessage::isText(void) const {
	if (!isMetaMessage()) {
		return false;
	} else if ((*this)[1] != 0x01) {
		return false;
	} else {
		return true;
	}
}